

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

RotationY<float> *
qclab::qgates::operator*
          (RotationY<float> *__return_storage_ptr__,RotationY<float> *lhs,RotationY<float> *rhs)

{
  int iVar1;
  int iVar2;
  RotationY<float> *rhs_local;
  RotationY<float> *lhs_local;
  
  iVar1 = QGate1<float>::qubit((QGate1<float> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationY<float>::operator*=(lhs,rhs);
    RotationY<float>::RotationY(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xb1,"RotationY<T> qclab::qgates::operator*(RotationY<T>, const RotationY<T> &)");
}

Assistant:

RotationY< T > operator*( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }